

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfft_common.c
# Opt level: O1

void bitrev_init(int n,int *rho)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  
  if (n == 1) {
    *rho = 0;
    return;
  }
  if (0 < n) {
    uVar1 = 0;
    do {
      iVar2 = 1;
      uVar3 = uVar1 & 0xffffffff;
      iVar4 = 0;
      do {
        uVar5 = (uint)uVar3;
        uVar3 = uVar3 >> 1;
        iVar4 = (uVar5 & 1) + iVar4 * 2;
        iVar2 = iVar2 * 2;
      } while (iVar2 < n);
      rho[uVar1] = iVar4;
      uVar1 = uVar1 + 1;
    } while (uVar1 != (uint)n);
  }
  return;
}

Assistant:

void bitrev_init(int n, int *rho)
    {
    int j;
    int n1, rem, val, k, lastbit, one=1;

    if (n==1)
        {
        rho[0]= 0;
        return;
        }
    n1= n;
    for(j=0; j<n; j++)
        {
        rem= j; 
        val= 0;
        for (k=1; k<n1; k <<= 1)
            {
            lastbit= rem & one;
            rem >>= 1;
            val <<= 1;
            val |= lastbit;
            }
        rho[j]= (int)val;
        }
   }